

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_change_stream_priority
              (nghttp2_session *session,int32_t stream_id,nghttp2_priority_spec *pri_spec)

{
  int iVar1;
  undefined1 local_44 [8];
  nghttp2_priority_spec pri_spec_copy;
  nghttp2_stream *stream;
  int rv;
  nghttp2_priority_spec *pri_spec_local;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  if (session->pending_no_rfc7540_priorities == '\x01') {
    session_local._4_4_ = 0;
  }
  else if ((stream_id == 0) || (stream_id == pri_spec->stream_id)) {
    session_local._4_4_ = -0x1f5;
  }
  else {
    pri_spec_copy._4_8_ = nghttp2_session_get_stream_raw(session,stream_id);
    if ((nghttp2_stream *)pri_spec_copy._4_8_ == (nghttp2_stream *)0x0) {
      session_local._4_4_ = -0x1f5;
    }
    else {
      local_44._0_4_ = pri_spec->stream_id;
      local_44._4_4_ = pri_spec->weight;
      pri_spec_copy.stream_id = *(int32_t *)&pri_spec->exclusive;
      nghttp2_priority_spec_normalize_weight((nghttp2_priority_spec *)local_44);
      session_local._4_4_ =
           nghttp2_session_reprioritize_stream
                     (session,(nghttp2_stream *)pri_spec_copy._4_8_,
                      (nghttp2_priority_spec *)local_44);
      iVar1 = nghttp2_is_fatal(session_local._4_4_);
      if (iVar1 == 0) {
        session_local._4_4_ = 0;
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_change_stream_priority(
    nghttp2_session *session, int32_t stream_id,
    const nghttp2_priority_spec *pri_spec) {
  int rv;
  nghttp2_stream *stream;
  nghttp2_priority_spec pri_spec_copy;

  if (session->pending_no_rfc7540_priorities == 1) {
    return 0;
  }

  if (stream_id == 0 || stream_id == pri_spec->stream_id) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  stream = nghttp2_session_get_stream_raw(session, stream_id);
  if (!stream) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  pri_spec_copy = *pri_spec;
  nghttp2_priority_spec_normalize_weight(&pri_spec_copy);

  rv = nghttp2_session_reprioritize_stream(session, stream, &pri_spec_copy);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  /* We don't intentionally call nghttp2_session_adjust_idle_stream()
     so that idle stream created by this function, and existing ones
     are kept for application.  We will adjust number of idle stream
     in nghttp2_session_mem_send or nghttp2_session_mem_recv is
     called. */
  return 0;
}